

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void fadst16x16_sse4_1(__m128i *in,__m128i *out,int bit,int num_cols)

{
  int *piVar1;
  int *piVar2;
  undefined8 *puVar3;
  int *piVar4;
  int *piVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  undefined4 uVar14;
  int iVar15;
  undefined4 uVar16;
  int iVar17;
  undefined4 uVar18;
  int iVar19;
  undefined4 uVar20;
  int iVar21;
  undefined4 uVar22;
  int iVar23;
  undefined4 uVar24;
  int iVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  long lVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  ulong uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar64;
  int iVar65;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar66;
  int iVar73;
  int iVar75;
  undefined1 auVar68 [16];
  int iVar67;
  int iVar74;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar81;
  int iVar82;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar92;
  int iVar93;
  int iVar97;
  int iVar99;
  undefined1 auVar94 [16];
  int iVar98;
  int iVar100;
  int iVar101;
  int iVar102;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int iVar103;
  int iVar110;
  int iVar111;
  int iVar115;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar116;
  int iVar117;
  int iVar118;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  int iVar119;
  int iVar126;
  int iVar127;
  int iVar128;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  int iVar142;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  int iVar143;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  int iVar144;
  int iVar150;
  int iVar151;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  int iVar152;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  int iVar153;
  int iVar157;
  int iVar158;
  undefined1 auVar154 [16];
  int iVar159;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  
  lVar43 = (long)bit * 0x100;
  uVar6 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x1e0);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x220);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x1a0);
  iVar53 = -iVar8;
  iVar44 = -iVar7;
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x168);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x180);
  iVar11 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x240);
  iVar56 = -iVar11;
  iVar54 = -iVar10;
  uVar12 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x1c0);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x200);
  iVar55 = -iVar13;
  uVar14 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 600);
  iVar45 = -iVar9;
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x188);
  uVar16 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x238);
  iVar46 = -iVar15;
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x1a8);
  uVar18 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x218);
  iVar47 = -iVar17;
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x1c8);
  uVar20 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x1f8);
  iVar48 = -iVar19;
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x1e8);
  uVar22 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x1d8);
  iVar49 = -iVar21;
  iVar23 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x208);
  uVar24 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x1b8);
  iVar50 = -iVar23;
  iVar25 = *(int *)((long)vert_filter_length_chroma + lVar43 + 0x228);
  uVar26 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x198);
  iVar51 = -iVar25;
  uVar27 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x248);
  iVar52 = 1 << ((char)bit - 1U & 0x1f);
  uVar28 = *(undefined4 *)((long)vert_filter_length_chroma + lVar43 + 0x178);
  lVar43 = 0;
  uVar57 = 0;
  if (0 < num_cols) {
    uVar57 = (ulong)(uint)num_cols;
  }
  for (; uVar57 << 4 != lVar43; lVar43 = lVar43 + 0x10) {
    piVar1 = (int *)((long)*in + lVar43);
    piVar2 = (int *)((long)in[num_cols * 0xf] + lVar43);
    puVar3 = (undefined8 *)((long)in[num_cols * 3] + lVar43);
    uVar29 = *puVar3;
    uVar30 = puVar3[1];
    piVar4 = (int *)((long)in[num_cols * 0xc] + lVar43);
    auVar42._4_4_ = uVar6;
    auVar42._0_4_ = uVar6;
    auVar42._8_4_ = uVar6;
    auVar42._12_4_ = uVar6;
    auVar68 = pmulld(*(undefined1 (*) [16])((long)in[num_cols * 7] + lVar43),auVar42);
    auVar94 = pmulld(*(undefined1 (*) [16])((long)in[num_cols * 8] + lVar43),auVar42);
    auVar163 = ZEXT416((uint)bit);
    iVar81 = (iVar52 - auVar68._0_4_) + auVar94._0_4_ >> auVar163;
    iVar86 = (iVar52 - auVar68._4_4_) + auVar94._4_4_ >> auVar163;
    iVar88 = (iVar52 - auVar68._8_4_) + auVar94._8_4_ >> auVar163;
    iVar90 = (iVar52 - auVar68._12_4_) + auVar94._12_4_ >> auVar163;
    iVar66 = iVar52 - (auVar94._0_4_ + auVar68._0_4_) >> auVar163;
    iVar73 = iVar52 - (auVar94._4_4_ + auVar68._4_4_) >> auVar163;
    iVar75 = iVar52 - (auVar94._8_4_ + auVar68._8_4_) >> auVar163;
    iVar78 = iVar52 - (auVar94._12_4_ + auVar68._12_4_) >> auVar163;
    auVar68 = pmulld(*(undefined1 (*) [16])((long)in[num_cols * 4] + lVar43),auVar42);
    auVar94 = pmulld(*(undefined1 (*) [16])((long)in[num_cols * 0xb] + lVar43),auVar42);
    iVar67 = auVar68._0_4_ + iVar52;
    iVar74 = auVar68._4_4_ + iVar52;
    iVar76 = auVar68._8_4_ + iVar52;
    iVar79 = auVar68._12_4_ + iVar52;
    iVar103 = iVar67 - auVar94._0_4_ >> auVar163;
    iVar110 = iVar74 - auVar94._4_4_ >> auVar163;
    iVar111 = iVar76 - auVar94._8_4_ >> auVar163;
    iVar115 = iVar79 - auVar94._12_4_ >> auVar163;
    iVar67 = iVar67 + auVar94._0_4_ >> auVar163;
    iVar74 = iVar74 + auVar94._4_4_ >> auVar163;
    iVar77 = iVar76 + auVar94._8_4_ >> auVar163;
    iVar80 = iVar79 + auVar94._12_4_ >> auVar163;
    auVar68 = pmulld(*(undefined1 (*) [16])((long)in[num_cols * 6] + lVar43),auVar42);
    auVar94 = pmulld(*(undefined1 (*) [16])((long)in[num_cols * 9] + lVar43),auVar42);
    iVar92 = auVar68._0_4_ + iVar52;
    iVar97 = auVar68._4_4_ + iVar52;
    iVar99 = auVar68._8_4_ + iVar52;
    iVar101 = auVar68._12_4_ + iVar52;
    iVar76 = iVar92 - auVar94._0_4_ >> auVar163;
    iVar79 = iVar97 - auVar94._4_4_ >> auVar163;
    iVar64 = iVar99 - auVar94._8_4_ >> auVar163;
    iVar65 = iVar101 - auVar94._12_4_ >> auVar163;
    piVar5 = (int *)((long)in[num_cols] + lVar43);
    iVar93 = iVar92 + auVar94._0_4_ >> auVar163;
    iVar98 = iVar97 + auVar94._4_4_ >> auVar163;
    iVar100 = iVar99 + auVar94._8_4_ >> auVar163;
    iVar102 = iVar101 + auVar94._12_4_ >> auVar163;
    puVar3 = (undefined8 *)((long)in[num_cols * 0xe] + lVar43);
    uVar31 = *puVar3;
    uVar32 = puVar3[1];
    auVar68 = pmulld(*(undefined1 (*) [16])((long)in[num_cols * 5] + lVar43),auVar42);
    auVar94 = pmulld(*(undefined1 (*) [16])((long)in[num_cols * 10] + lVar43),auVar42);
    iVar119 = iVar81 + *piVar1;
    iVar126 = iVar86 + piVar1[1];
    iVar127 = iVar88 + piVar1[2];
    iVar128 = iVar90 + piVar1[3];
    iVar81 = *piVar1 - iVar81;
    iVar86 = piVar1[1] - iVar86;
    iVar88 = piVar1[2] - iVar88;
    iVar90 = piVar1[3] - iVar90;
    iVar82 = iVar66 - *piVar2;
    iVar87 = iVar73 - piVar2[1];
    iVar89 = iVar75 - piVar2[2];
    iVar91 = iVar78 - piVar2[3];
    iVar66 = iVar66 + *piVar2;
    iVar73 = iVar73 + piVar2[1];
    iVar75 = iVar75 + piVar2[2];
    iVar78 = iVar78 + piVar2[3];
    local_3f8._0_4_ = (int)uVar29;
    local_3f8._4_4_ = (int)((ulong)uVar29 >> 0x20);
    uStack_3f0._0_4_ = (int)uVar30;
    uStack_3f0._4_4_ = (int)((ulong)uVar30 >> 0x20);
    auVar129._0_4_ = iVar103 - (int)local_3f8;
    auVar129._4_4_ = iVar110 - local_3f8._4_4_;
    auVar129._8_4_ = iVar111 - (int)uStack_3f0;
    auVar129._12_4_ = iVar115 - uStack_3f0._4_4_;
    auVar120._4_4_ = -(iVar110 + local_3f8._4_4_);
    auVar120._0_4_ = -(iVar103 + (int)local_3f8);
    auVar120._8_4_ = -(iVar111 + (int)uStack_3f0);
    auVar120._12_4_ = -(iVar115 + uStack_3f0._4_4_);
    auVar58._0_4_ = iVar67 + *piVar4;
    auVar58._4_4_ = iVar74 + piVar4[1];
    auVar58._8_4_ = iVar77 + piVar4[2];
    auVar58._12_4_ = iVar80 + piVar4[3];
    auVar134._0_4_ = *piVar4 - iVar67;
    auVar134._4_4_ = piVar4[1] - iVar74;
    auVar134._8_4_ = piVar4[2] - iVar77;
    auVar134._12_4_ = piVar4[3] - iVar80;
    iVar67 = iVar76 - *piVar5;
    iVar74 = iVar79 - piVar5[1];
    iVar92 = iVar64 - piVar5[2];
    iVar99 = iVar65 - piVar5[3];
    iVar76 = iVar76 + *piVar5;
    iVar79 = iVar79 + piVar5[1];
    iVar64 = iVar64 + piVar5[2];
    iVar65 = iVar65 + piVar5[3];
    local_3d8._0_4_ = (int)uVar31;
    local_3d8._4_4_ = (int)((ulong)uVar31 >> 0x20);
    uStack_3d0._0_4_ = (int)uVar32;
    uStack_3d0._4_4_ = (int)((ulong)uVar32 >> 0x20);
    iVar77 = iVar93 + (int)local_3d8;
    iVar80 = iVar98 + local_3d8._4_4_;
    iVar97 = iVar100 + (int)uStack_3d0;
    iVar101 = iVar102 + uStack_3d0._4_4_;
    local_3d8._0_4_ = (int)local_3d8 - iVar93;
    local_3d8._4_4_ = local_3d8._4_4_ - iVar98;
    uStack_3d0._0_4_ = (int)uStack_3d0 - iVar100;
    uStack_3d0._4_4_ = uStack_3d0._4_4_ - iVar102;
    piVar1 = (int *)((long)in[num_cols * 2] + lVar43);
    iVar93 = (iVar52 - auVar68._0_4_) + auVar94._0_4_ >> auVar163;
    iVar98 = (iVar52 - auVar68._4_4_) + auVar94._4_4_ >> auVar163;
    iVar100 = (iVar52 - auVar68._8_4_) + auVar94._8_4_ >> auVar163;
    iVar102 = (iVar52 - auVar68._12_4_) + auVar94._12_4_ >> auVar163;
    auVar83._0_4_ = iVar93 + *piVar1;
    auVar83._4_4_ = iVar98 + piVar1[1];
    auVar83._8_4_ = iVar100 + piVar1[2];
    auVar83._12_4_ = iVar102 + piVar1[3];
    auVar62._0_4_ = *piVar1 - iVar93;
    auVar62._4_4_ = piVar1[1] - iVar98;
    auVar62._8_4_ = piVar1[2] - iVar100;
    auVar62._12_4_ = piVar1[3] - iVar102;
    iVar93 = iVar52 - (auVar94._0_4_ + auVar68._0_4_) >> auVar163;
    iVar98 = iVar52 - (auVar94._4_4_ + auVar68._4_4_) >> auVar163;
    iVar100 = iVar52 - (auVar94._8_4_ + auVar68._8_4_) >> auVar163;
    iVar102 = iVar52 - (auVar94._12_4_ + auVar68._12_4_) >> auVar163;
    piVar1 = (int *)((long)in[num_cols * 0xd] + lVar43);
    auVar164._0_4_ = iVar93 - *piVar1;
    auVar164._4_4_ = iVar98 - piVar1[1];
    auVar164._8_4_ = iVar100 - piVar1[2];
    auVar164._12_4_ = iVar102 - piVar1[3];
    auVar104._4_4_ = -(iVar98 + piVar1[1]);
    auVar104._0_4_ = -(iVar93 + *piVar1);
    auVar104._8_4_ = -(iVar100 + piVar1[2]);
    auVar104._12_4_ = -(iVar102 + piVar1[3]);
    auVar40._4_4_ = iVar8;
    auVar40._0_4_ = iVar8;
    auVar40._8_4_ = iVar8;
    auVar40._12_4_ = iVar8;
    auVar145 = pmulld(auVar129,auVar40);
    auVar41._4_4_ = iVar7;
    auVar41._0_4_ = iVar7;
    auVar41._8_4_ = iVar7;
    auVar41._12_4_ = iVar7;
    auVar69 = pmulld(auVar58,auVar41);
    auVar130 = pmulld(auVar129,auVar41);
    auVar39._4_4_ = iVar53;
    auVar39._0_4_ = iVar53;
    auVar39._8_4_ = iVar53;
    auVar39._12_4_ = iVar53;
    auVar68 = pmulld(auVar58,auVar39);
    auVar121._4_4_ = iVar44;
    auVar121._0_4_ = iVar44;
    auVar121._8_4_ = iVar44;
    auVar121._12_4_ = iVar44;
    auVar94 = pmulld(auVar121,auVar120);
    auVar154 = pmulld(auVar134,auVar40);
    auVar121 = pmulld(auVar120,auVar40);
    auVar135 = pmulld(auVar134,auVar41);
    auVar70 = pmulld(auVar83,auVar40);
    auVar59 = pmulld(auVar164,auVar41);
    auVar84 = pmulld(auVar83,auVar41);
    auVar165 = pmulld(auVar164,auVar39);
    auVar122._4_4_ = iVar44;
    auVar122._0_4_ = iVar44;
    auVar122._8_4_ = iVar44;
    auVar122._12_4_ = iVar44;
    auVar60 = pmulld(auVar62,auVar122);
    auVar122 = pmulld(auVar40,auVar104);
    auVar63 = pmulld(auVar62,auVar40);
    auVar105 = pmulld(auVar104,auVar41);
    iVar98 = auVar145._0_4_ + iVar52 + auVar69._0_4_ >> auVar163;
    iVar100 = auVar145._4_4_ + iVar52 + auVar69._4_4_ >> auVar163;
    iVar102 = auVar145._8_4_ + iVar52 + auVar69._8_4_ >> auVar163;
    iVar110 = auVar145._12_4_ + iVar52 + auVar69._12_4_ >> auVar163;
    iVar93 = iVar98 + iVar119;
    iVar103 = iVar100 + iVar126;
    iVar112 = iVar102 + iVar127;
    iVar116 = iVar110 + iVar128;
    iVar119 = iVar119 - iVar98;
    iVar126 = iVar126 - iVar100;
    iVar127 = iVar127 - iVar102;
    iVar128 = iVar128 - iVar110;
    iVar100 = auVar130._0_4_ + iVar52 + auVar68._0_4_ >> auVar163;
    iVar102 = auVar130._4_4_ + iVar52 + auVar68._4_4_ >> auVar163;
    iVar111 = auVar130._8_4_ + iVar52 + auVar68._8_4_ >> auVar163;
    iVar115 = auVar130._12_4_ + iVar52 + auVar68._12_4_ >> auVar163;
    iVar153 = auVar154._0_4_ + iVar52 + auVar94._0_4_ >> auVar163;
    iVar157 = auVar154._4_4_ + iVar52 + auVar94._4_4_ >> auVar163;
    iVar158 = auVar154._8_4_ + iVar52 + auVar94._8_4_ >> auVar163;
    iVar159 = auVar154._12_4_ + iVar52 + auVar94._12_4_ >> auVar163;
    iVar98 = iVar100 + iVar82;
    iVar110 = iVar102 + iVar87;
    iVar113 = iVar111 + iVar89;
    iVar117 = iVar115 + iVar91;
    iVar82 = iVar82 - iVar100;
    iVar87 = iVar87 - iVar102;
    iVar89 = iVar89 - iVar111;
    iVar91 = iVar91 - iVar115;
    iVar100 = iVar153 + iVar81;
    iVar111 = iVar157 + iVar86;
    iVar114 = iVar158 + iVar88;
    iVar118 = iVar159 + iVar90;
    iVar81 = iVar81 - iVar153;
    iVar86 = iVar86 - iVar157;
    iVar88 = iVar88 - iVar158;
    iVar90 = iVar90 - iVar159;
    iVar158 = auVar135._0_4_ + iVar52 + auVar121._0_4_ >> auVar163;
    iVar159 = auVar135._4_4_ + iVar52 + auVar121._4_4_ >> auVar163;
    iVar142 = auVar135._8_4_ + iVar52 + auVar121._8_4_ >> auVar163;
    iVar143 = auVar135._12_4_ + iVar52 + auVar121._12_4_ >> auVar163;
    iVar102 = iVar158 - iVar66;
    iVar115 = iVar159 - iVar73;
    iVar153 = iVar142 - iVar75;
    iVar157 = iVar143 - iVar78;
    iVar158 = iVar158 + iVar66;
    iVar159 = iVar159 + iVar73;
    iVar142 = iVar142 + iVar75;
    iVar143 = iVar143 + iVar78;
    iVar66 = auVar70._0_4_ + iVar52 + auVar59._0_4_ >> auVar163;
    iVar73 = auVar70._4_4_ + iVar52 + auVar59._4_4_ >> auVar163;
    iVar75 = auVar70._8_4_ + iVar52 + auVar59._8_4_ >> auVar163;
    iVar78 = auVar70._12_4_ + iVar52 + auVar59._12_4_ >> auVar163;
    auVar146._0_4_ = iVar66 + iVar67;
    auVar146._4_4_ = iVar73 + iVar74;
    auVar146._8_4_ = iVar75 + iVar92;
    auVar146._12_4_ = iVar78 + iVar99;
    auVar166._0_4_ = iVar67 - iVar66;
    auVar166._4_4_ = iVar74 - iVar73;
    auVar166._8_4_ = iVar92 - iVar75;
    auVar166._12_4_ = iVar99 - iVar78;
    iVar75 = auVar84._0_4_ + iVar52 + auVar165._0_4_ >> auVar163;
    iVar92 = auVar84._4_4_ + iVar52 + auVar165._4_4_ >> auVar163;
    iVar78 = auVar84._8_4_ + iVar52 + auVar165._8_4_ >> auVar163;
    iVar99 = auVar84._12_4_ + iVar52 + auVar165._12_4_ >> auVar163;
    iVar66 = auVar60._0_4_ + iVar52 + auVar122._0_4_ >> auVar163;
    iVar67 = auVar60._4_4_ + iVar52 + auVar122._4_4_ >> auVar163;
    iVar73 = auVar60._8_4_ + iVar52 + auVar122._8_4_ >> auVar163;
    iVar74 = auVar60._12_4_ + iVar52 + auVar122._12_4_ >> auVar163;
    auVar123._0_4_ = iVar75 + iVar77;
    auVar123._4_4_ = iVar92 + iVar80;
    auVar123._8_4_ = iVar78 + iVar97;
    auVar123._12_4_ = iVar99 + iVar101;
    auVar136._0_4_ = iVar77 - iVar75;
    auVar136._4_4_ = iVar80 - iVar92;
    auVar136._8_4_ = iVar97 - iVar78;
    auVar136._12_4_ = iVar101 - iVar99;
    auVar71._0_4_ = iVar66 - iVar76;
    auVar71._4_4_ = iVar67 - iVar79;
    auVar71._8_4_ = iVar73 - iVar64;
    auVar71._12_4_ = iVar74 - iVar65;
    auVar61._0_4_ = iVar66 + iVar76;
    auVar61._4_4_ = iVar67 + iVar79;
    auVar61._8_4_ = iVar73 + iVar64;
    auVar61._12_4_ = iVar74 + iVar65;
    iVar66 = auVar63._0_4_ + iVar52 + auVar105._0_4_ >> auVar163;
    iVar67 = auVar63._4_4_ + iVar52 + auVar105._4_4_ >> auVar163;
    iVar73 = auVar63._8_4_ + iVar52 + auVar105._8_4_ >> auVar163;
    iVar74 = auVar63._12_4_ + iVar52 + auVar105._12_4_ >> auVar163;
    auVar95._0_4_ = iVar66 + (int)local_3d8;
    auVar95._4_4_ = iVar67 + local_3d8._4_4_;
    auVar95._8_4_ = iVar73 + (int)uStack_3d0;
    auVar95._12_4_ = iVar74 + uStack_3d0._4_4_;
    auVar169._0_4_ = (int)local_3d8 - iVar66;
    auVar169._4_4_ = local_3d8._4_4_ - iVar67;
    auVar169._8_4_ = (int)uStack_3d0 - iVar73;
    auVar169._12_4_ = uStack_3d0._4_4_ - iVar74;
    auVar38._4_4_ = iVar10;
    auVar38._0_4_ = iVar10;
    auVar38._8_4_ = iVar10;
    auVar38._12_4_ = iVar10;
    auVar94 = pmulld(auVar146,auVar38);
    auVar37._4_4_ = iVar11;
    auVar37._0_4_ = iVar11;
    auVar37._8_4_ = iVar11;
    auVar37._12_4_ = iVar11;
    auVar60 = pmulld(auVar123,auVar37);
    auVar154 = pmulld(auVar146,auVar37);
    auVar35._4_4_ = iVar54;
    auVar35._0_4_ = iVar54;
    auVar35._8_4_ = iVar54;
    auVar35._12_4_ = iVar54;
    auVar84 = pmulld(auVar123,auVar35);
    auVar137._4_4_ = iVar13;
    auVar137._0_4_ = iVar13;
    auVar137._8_4_ = iVar13;
    auVar137._12_4_ = iVar13;
    auVar63 = pmulld(auVar71,auVar137);
    auVar34._4_4_ = uVar12;
    auVar34._0_4_ = uVar12;
    auVar34._8_4_ = uVar12;
    auVar34._12_4_ = uVar12;
    auVar105 = pmulld(auVar95,auVar34);
    auVar59 = pmulld(auVar71,auVar34);
    auVar33._4_4_ = iVar55;
    auVar33._0_4_ = iVar55;
    auVar33._8_4_ = iVar55;
    auVar33._12_4_ = iVar55;
    auVar69 = pmulld(auVar95,auVar33);
    auVar36._4_4_ = iVar56;
    auVar36._0_4_ = iVar56;
    auVar36._8_4_ = iVar56;
    auVar36._12_4_ = iVar56;
    auVar70 = pmulld(auVar166,auVar36);
    auVar121 = pmulld(auVar136,auVar38);
    auVar122 = pmulld(auVar166,auVar38);
    auVar135 = pmulld(auVar136,auVar37);
    auVar130 = pmulld(auVar137,auVar61);
    auVar68 = pmulld(auVar61,auVar34);
    auVar145 = pmulld(auVar169,auVar137);
    auVar165 = pmulld(auVar169,auVar34);
    iVar76 = auVar94._0_4_ + iVar52 + auVar60._0_4_ >> auVar163;
    iVar79 = auVar94._4_4_ + iVar52 + auVar60._4_4_ >> auVar163;
    iVar64 = auVar94._8_4_ + iVar52 + auVar60._8_4_ >> auVar163;
    iVar65 = auVar94._12_4_ + iVar52 + auVar60._12_4_ >> auVar163;
    iVar144 = auVar154._0_4_ + iVar52 + auVar84._0_4_ >> auVar163;
    iVar150 = auVar154._4_4_ + iVar52 + auVar84._4_4_ >> auVar163;
    iVar151 = auVar154._8_4_ + iVar52 + auVar84._8_4_ >> auVar163;
    iVar152 = auVar154._12_4_ + iVar52 + auVar84._12_4_ >> auVar163;
    auVar170._0_4_ = iVar93 - iVar76;
    auVar170._4_4_ = iVar103 - iVar79;
    auVar170._8_4_ = iVar112 - iVar64;
    auVar170._12_4_ = iVar116 - iVar65;
    auVar155._0_4_ = iVar144 + iVar98;
    auVar155._4_4_ = iVar150 + iVar110;
    auVar155._8_4_ = iVar151 + iVar113;
    auVar155._12_4_ = iVar152 + iVar117;
    iVar66 = auVar63._0_4_ + iVar52 + auVar105._0_4_ >> auVar163;
    iVar67 = auVar63._4_4_ + iVar52 + auVar105._4_4_ >> auVar163;
    iVar73 = auVar63._8_4_ + iVar52 + auVar105._8_4_ >> auVar163;
    iVar74 = auVar63._12_4_ + iVar52 + auVar105._12_4_ >> auVar163;
    auVar131._0_4_ = iVar66 + iVar100;
    auVar131._4_4_ = iVar67 + iVar111;
    auVar131._8_4_ = iVar73 + iVar114;
    auVar131._12_4_ = iVar74 + iVar118;
    auVar124._0_4_ = iVar100 - iVar66;
    auVar124._4_4_ = iVar111 - iVar67;
    auVar124._8_4_ = iVar114 - iVar73;
    auVar124._12_4_ = iVar118 - iVar74;
    iVar77 = auVar59._0_4_ + iVar52 + auVar69._0_4_ >> auVar163;
    iVar80 = auVar59._4_4_ + iVar52 + auVar69._4_4_ >> auVar163;
    iVar75 = auVar59._8_4_ + iVar52 + auVar69._8_4_ >> auVar163;
    iVar92 = auVar59._12_4_ + iVar52 + auVar69._12_4_ >> auVar163;
    auVar85._0_4_ = iVar77 + iVar102;
    auVar85._4_4_ = iVar80 + iVar115;
    auVar85._8_4_ = iVar75 + iVar153;
    auVar85._12_4_ = iVar92 + iVar157;
    iVar97 = auVar70._0_4_ + iVar52 + auVar121._0_4_ >> auVar163;
    iVar78 = auVar70._4_4_ + iVar52 + auVar121._4_4_ >> auVar163;
    iVar99 = auVar70._8_4_ + iVar52 + auVar121._8_4_ >> auVar163;
    iVar101 = auVar70._12_4_ + iVar52 + auVar121._12_4_ >> auVar163;
    iVar66 = auVar122._0_4_ + iVar52 + auVar135._0_4_ >> auVar163;
    iVar67 = auVar122._4_4_ + iVar52 + auVar135._4_4_ >> auVar163;
    iVar73 = auVar122._8_4_ + iVar52 + auVar135._8_4_ >> auVar163;
    iVar74 = auVar122._12_4_ + iVar52 + auVar135._12_4_ >> auVar163;
    auVar72._0_4_ = iVar97 + iVar119;
    auVar72._4_4_ = iVar78 + iVar126;
    auVar72._8_4_ = iVar99 + iVar127;
    auVar72._12_4_ = iVar101 + iVar128;
    auVar160._0_4_ = iVar66 + iVar82;
    auVar160._4_4_ = iVar67 + iVar87;
    auVar160._8_4_ = iVar73 + iVar89;
    auVar160._12_4_ = iVar74 + iVar91;
    auVar96._0_4_ = iVar82 - iVar66;
    auVar96._4_4_ = iVar87 - iVar67;
    auVar96._8_4_ = iVar89 - iVar73;
    auVar96._12_4_ = iVar91 - iVar74;
    iVar66 = auVar68._0_4_ + iVar52 + auVar145._0_4_ >> auVar163;
    iVar67 = auVar68._4_4_ + iVar52 + auVar145._4_4_ >> auVar163;
    iVar73 = auVar68._8_4_ + iVar52 + auVar145._8_4_ >> auVar163;
    iVar74 = auVar68._12_4_ + iVar52 + auVar145._12_4_ >> auVar163;
    auVar167._0_4_ = iVar66 + iVar81;
    auVar167._4_4_ = iVar67 + iVar86;
    auVar167._8_4_ = iVar73 + iVar88;
    auVar167._12_4_ = iVar74 + iVar90;
    iVar81 = iVar81 - iVar66;
    iVar86 = iVar86 - iVar67;
    iVar88 = iVar88 - iVar73;
    iVar90 = iVar90 - iVar74;
    iVar66 = (iVar52 - auVar130._0_4_) + auVar165._0_4_ >> auVar163;
    iVar67 = (iVar52 - auVar130._4_4_) + auVar165._4_4_ >> auVar163;
    iVar73 = (iVar52 - auVar130._8_4_) + auVar165._8_4_ >> auVar163;
    iVar74 = (iVar52 - auVar130._12_4_) + auVar165._12_4_ >> auVar163;
    auVar147._0_4_ = iVar66 - iVar158;
    auVar147._4_4_ = iVar67 - iVar159;
    auVar147._8_4_ = iVar73 - iVar142;
    auVar147._12_4_ = iVar74 - iVar143;
    auVar63._4_4_ = iVar79 + iVar103;
    auVar63._0_4_ = iVar76 + iVar93;
    auVar63._8_4_ = iVar64 + iVar112;
    auVar63._12_4_ = iVar65 + iVar116;
    auVar106._4_4_ = iVar9;
    auVar106._0_4_ = iVar9;
    auVar106._8_4_ = iVar9;
    auVar106._12_4_ = iVar9;
    auVar137 = pmulld(auVar63,auVar106);
    auVar156._4_4_ = uVar14;
    auVar156._0_4_ = uVar14;
    auVar156._8_4_ = uVar14;
    auVar156._12_4_ = uVar14;
    auVar106 = pmulld(auVar155,auVar156);
    auVar63 = pmulld(auVar63,auVar156);
    auVar138._4_4_ = iVar45;
    auVar138._0_4_ = iVar45;
    auVar138._8_4_ = iVar45;
    auVar138._12_4_ = iVar45;
    auVar156 = pmulld(auVar155,auVar138);
    auVar107._4_4_ = iVar15;
    auVar107._0_4_ = iVar15;
    auVar107._8_4_ = iVar15;
    auVar107._12_4_ = iVar15;
    auVar138 = pmulld(auVar131,auVar107);
    auVar132._4_4_ = uVar16;
    auVar132._0_4_ = uVar16;
    auVar132._8_4_ = uVar16;
    auVar132._12_4_ = uVar16;
    auVar107 = pmulld(auVar85,auVar132);
    auVar132 = pmulld(auVar131,auVar132);
    auVar168._4_4_ = iVar46;
    auVar168._0_4_ = iVar46;
    auVar168._8_4_ = iVar46;
    auVar168._12_4_ = iVar46;
    auVar121 = pmulld(auVar85,auVar168);
    auVar108._4_4_ = iVar17;
    auVar108._0_4_ = iVar17;
    auVar108._8_4_ = iVar17;
    auVar108._12_4_ = iVar17;
    auVar105 = pmulld(auVar72,auVar108);
    auVar161._4_4_ = uVar18;
    auVar161._0_4_ = uVar18;
    auVar161._8_4_ = uVar18;
    auVar161._12_4_ = uVar18;
    auVar108 = pmulld(auVar160,auVar161);
    auVar122 = pmulld(auVar72,auVar161);
    auVar139._4_4_ = iVar47;
    auVar139._0_4_ = iVar47;
    auVar139._8_4_ = iVar47;
    auVar139._12_4_ = iVar47;
    auVar161 = pmulld(auVar160,auVar139);
    auVar109._4_4_ = iVar19;
    auVar109._0_4_ = iVar19;
    auVar109._8_4_ = iVar19;
    auVar109._12_4_ = iVar19;
    auVar109 = pmulld(auVar167,auVar109);
    auVar149._4_4_ = uVar20;
    auVar149._0_4_ = uVar20;
    auVar149._8_4_ = uVar20;
    auVar149._12_4_ = uVar20;
    auVar139 = pmulld(auVar147,auVar149);
    auVar168 = pmulld(auVar167,auVar149);
    auVar148._4_4_ = iVar48;
    auVar148._0_4_ = iVar48;
    auVar148._8_4_ = iVar48;
    auVar148._12_4_ = iVar48;
    auVar148 = pmulld(auVar147,auVar148);
    auVar140._4_4_ = iVar21;
    auVar140._0_4_ = iVar21;
    auVar140._8_4_ = iVar21;
    auVar140._12_4_ = iVar21;
    auVar149 = pmulld(auVar170,auVar140);
    auVar69._4_4_ = iVar110 - iVar150;
    auVar69._0_4_ = iVar98 - iVar144;
    auVar69._8_4_ = iVar113 - iVar151;
    auVar69._12_4_ = iVar117 - iVar152;
    auVar133._4_4_ = uVar22;
    auVar133._0_4_ = uVar22;
    auVar133._8_4_ = uVar22;
    auVar133._12_4_ = uVar22;
    auVar140 = pmulld(auVar69,auVar133);
    auVar133 = pmulld(auVar170,auVar133);
    auVar162._4_4_ = iVar49;
    auVar162._0_4_ = iVar49;
    auVar162._8_4_ = iVar49;
    auVar162._12_4_ = iVar49;
    auVar69 = pmulld(auVar69,auVar162);
    auVar141._4_4_ = iVar23;
    auVar141._0_4_ = iVar23;
    auVar141._8_4_ = iVar23;
    auVar141._12_4_ = iVar23;
    auVar141 = pmulld(auVar124,auVar141);
    auVar70._4_4_ = iVar115 - iVar80;
    auVar70._0_4_ = iVar102 - iVar77;
    auVar70._8_4_ = iVar153 - iVar75;
    auVar70._12_4_ = iVar157 - iVar92;
    auVar125._4_4_ = uVar24;
    auVar125._0_4_ = uVar24;
    auVar125._8_4_ = uVar24;
    auVar125._12_4_ = uVar24;
    auVar162 = pmulld(auVar70,auVar125);
    auVar125 = pmulld(auVar124,auVar125);
    auVar165._4_4_ = iVar50;
    auVar165._0_4_ = iVar50;
    auVar165._8_4_ = iVar50;
    auVar165._12_4_ = iVar50;
    auVar94 = pmulld(auVar70,auVar165);
    auVar59._4_4_ = iVar126 - iVar78;
    auVar59._0_4_ = iVar119 - iVar97;
    auVar59._8_4_ = iVar127 - iVar99;
    auVar59._12_4_ = iVar128 - iVar101;
    auVar154._4_4_ = iVar25;
    auVar154._0_4_ = iVar25;
    auVar154._8_4_ = iVar25;
    auVar154._12_4_ = iVar25;
    auVar154 = pmulld(auVar59,auVar154);
    auVar145._4_4_ = uVar26;
    auVar145._0_4_ = uVar26;
    auVar145._8_4_ = uVar26;
    auVar145._12_4_ = uVar26;
    auVar165 = pmulld(auVar96,auVar145);
    auVar145 = pmulld(auVar59,auVar145);
    auVar135._4_4_ = iVar51;
    auVar135._0_4_ = iVar51;
    auVar135._8_4_ = iVar51;
    auVar135._12_4_ = iVar51;
    auVar70 = pmulld(auVar96,auVar135);
    auVar68._4_4_ = iVar86;
    auVar68._0_4_ = iVar81;
    auVar68._8_4_ = iVar88;
    auVar68._12_4_ = iVar90;
    auVar84._4_4_ = uVar27;
    auVar84._0_4_ = uVar27;
    auVar84._8_4_ = uVar27;
    auVar84._12_4_ = uVar27;
    auVar84 = pmulld(auVar68,auVar84);
    auVar130._4_4_ = uVar28;
    auVar130._0_4_ = uVar28;
    auVar130._8_4_ = uVar28;
    auVar130._12_4_ = uVar28;
    auVar60._4_4_ = iVar67 + iVar159;
    auVar60._0_4_ = iVar66 + iVar158;
    auVar60._8_4_ = iVar73 + iVar142;
    auVar60._12_4_ = iVar74 + iVar143;
    auVar68 = pmulld(auVar130,auVar60);
    local_3d8 = CONCAT44(auVar105._4_4_ + iVar52 + auVar108._4_4_ >> auVar163,
                         auVar105._0_4_ + iVar52 + auVar108._0_4_ >> auVar163);
    uStack_3d0 = CONCAT44(auVar105._12_4_ + iVar52 + auVar108._12_4_ >> auVar163,
                          auVar105._8_4_ + iVar52 + auVar108._8_4_ >> auVar163);
    local_3f8 = CONCAT44(auVar125._4_4_ + iVar52 + auVar94._4_4_ >> auVar163,
                         auVar125._0_4_ + iVar52 + auVar94._0_4_ >> auVar163);
    uStack_3f0 = CONCAT44(auVar125._12_4_ + iVar52 + auVar94._12_4_ >> auVar163,
                          auVar125._8_4_ + iVar52 + auVar94._8_4_ >> auVar163);
    auVar94._4_4_ = iVar86;
    auVar94._0_4_ = iVar81;
    auVar94._8_4_ = iVar88;
    auVar94._12_4_ = iVar90;
    auVar94 = pmulld(auVar94,auVar130);
    auVar105._4_4_ = uVar27;
    auVar105._0_4_ = uVar27;
    auVar105._8_4_ = uVar27;
    auVar105._12_4_ = uVar27;
    auVar59 = pmulld(auVar60,auVar105);
    piVar1 = (int *)((long)*out + lVar43);
    *piVar1 = auVar63._0_4_ + iVar52 + auVar156._0_4_ >> auVar163;
    piVar1[1] = auVar63._4_4_ + iVar52 + auVar156._4_4_ >> auVar163;
    piVar1[2] = auVar63._8_4_ + iVar52 + auVar156._8_4_ >> auVar163;
    piVar1[3] = auVar63._12_4_ + iVar52 + auVar156._12_4_ >> auVar163;
    piVar1 = (int *)((long)out[num_cols] + lVar43);
    *piVar1 = (auVar84._0_4_ + iVar52) - auVar68._0_4_ >> auVar163;
    piVar1[1] = (auVar84._4_4_ + iVar52) - auVar68._4_4_ >> auVar163;
    piVar1[2] = (auVar84._8_4_ + iVar52) - auVar68._8_4_ >> auVar163;
    piVar1[3] = (auVar84._12_4_ + iVar52) - auVar68._12_4_ >> auVar163;
    piVar1 = (int *)((long)out[num_cols * 2] + lVar43);
    *piVar1 = auVar132._0_4_ + iVar52 + auVar121._0_4_ >> auVar163;
    piVar1[1] = auVar132._4_4_ + iVar52 + auVar121._4_4_ >> auVar163;
    piVar1[2] = auVar132._8_4_ + iVar52 + auVar121._8_4_ >> auVar163;
    piVar1[3] = auVar132._12_4_ + iVar52 + auVar121._12_4_ >> auVar163;
    piVar1 = (int *)((long)out[num_cols * 3] + lVar43);
    *piVar1 = auVar154._0_4_ + iVar52 + auVar165._0_4_ >> auVar163;
    piVar1[1] = auVar154._4_4_ + iVar52 + auVar165._4_4_ >> auVar163;
    piVar1[2] = auVar154._8_4_ + iVar52 + auVar165._8_4_ >> auVar163;
    piVar1[3] = auVar154._12_4_ + iVar52 + auVar165._12_4_ >> auVar163;
    piVar1 = (int *)((long)out[num_cols * 4] + lVar43);
    *piVar1 = auVar122._0_4_ + iVar52 + auVar161._0_4_ >> auVar163;
    piVar1[1] = auVar122._4_4_ + iVar52 + auVar161._4_4_ >> auVar163;
    piVar1[2] = auVar122._8_4_ + iVar52 + auVar161._8_4_ >> auVar163;
    piVar1[3] = auVar122._12_4_ + iVar52 + auVar161._12_4_ >> auVar163;
    piVar1 = (int *)((long)out[num_cols * 5] + lVar43);
    *piVar1 = auVar141._0_4_ + iVar52 + auVar162._0_4_ >> auVar163;
    piVar1[1] = auVar141._4_4_ + iVar52 + auVar162._4_4_ >> auVar163;
    piVar1[2] = auVar141._8_4_ + iVar52 + auVar162._8_4_ >> auVar163;
    piVar1[3] = auVar141._12_4_ + iVar52 + auVar162._12_4_ >> auVar163;
    piVar1 = (int *)((long)out[num_cols * 6] + lVar43);
    *piVar1 = auVar168._0_4_ + iVar52 + auVar148._0_4_ >> auVar163;
    piVar1[1] = auVar168._4_4_ + iVar52 + auVar148._4_4_ >> auVar163;
    piVar1[2] = auVar168._8_4_ + iVar52 + auVar148._8_4_ >> auVar163;
    piVar1[3] = auVar168._12_4_ + iVar52 + auVar148._12_4_ >> auVar163;
    piVar1 = (int *)((long)out[num_cols * 7] + lVar43);
    *piVar1 = auVar149._0_4_ + iVar52 + auVar140._0_4_ >> auVar163;
    piVar1[1] = auVar149._4_4_ + iVar52 + auVar140._4_4_ >> auVar163;
    piVar1[2] = auVar149._8_4_ + iVar52 + auVar140._8_4_ >> auVar163;
    piVar1[3] = auVar149._12_4_ + iVar52 + auVar140._12_4_ >> auVar163;
    puVar3 = (undefined8 *)((long)out[num_cols * 8] + lVar43);
    *puVar3 = CONCAT44(auVar133._4_4_ + iVar52 + auVar69._4_4_ >> auVar163,
                       auVar133._0_4_ + iVar52 + auVar69._0_4_ >> auVar163);
    puVar3[1] = CONCAT44(auVar133._12_4_ + iVar52 + auVar69._12_4_ >> auVar163,
                         auVar133._8_4_ + iVar52 + auVar69._8_4_ >> auVar163);
    piVar1 = (int *)((long)out[num_cols * 9] + lVar43);
    *piVar1 = auVar109._0_4_ + iVar52 + auVar139._0_4_ >> auVar163;
    piVar1[1] = auVar109._4_4_ + iVar52 + auVar139._4_4_ >> auVar163;
    piVar1[2] = auVar109._8_4_ + iVar52 + auVar139._8_4_ >> auVar163;
    piVar1[3] = auVar109._12_4_ + iVar52 + auVar139._12_4_ >> auVar163;
    puVar3 = (undefined8 *)((long)out[num_cols * 10] + lVar43);
    *puVar3 = local_3f8;
    puVar3[1] = uStack_3f0;
    puVar3 = (undefined8 *)((long)out[num_cols * 0xb] + lVar43);
    *puVar3 = local_3d8;
    puVar3[1] = uStack_3d0;
    piVar1 = (int *)((long)out[num_cols * 0xc] + lVar43);
    *piVar1 = auVar145._0_4_ + iVar52 + auVar70._0_4_ >> auVar163;
    piVar1[1] = auVar145._4_4_ + iVar52 + auVar70._4_4_ >> auVar163;
    piVar1[2] = auVar145._8_4_ + iVar52 + auVar70._8_4_ >> auVar163;
    piVar1[3] = auVar145._12_4_ + iVar52 + auVar70._12_4_ >> auVar163;
    puVar3 = (undefined8 *)((long)out[num_cols * 0xd] + lVar43);
    *puVar3 = CONCAT44(auVar138._4_4_ + iVar52 + auVar107._4_4_ >> auVar163,
                       auVar138._0_4_ + iVar52 + auVar107._0_4_ >> auVar163);
    puVar3[1] = CONCAT44(auVar138._12_4_ + iVar52 + auVar107._12_4_ >> auVar163,
                         auVar138._8_4_ + iVar52 + auVar107._8_4_ >> auVar163);
    piVar1 = (int *)((long)out[num_cols * 0xe] + lVar43);
    *piVar1 = auVar94._0_4_ + iVar52 + auVar59._0_4_ >> auVar163;
    piVar1[1] = auVar94._4_4_ + iVar52 + auVar59._4_4_ >> auVar163;
    piVar1[2] = auVar94._8_4_ + iVar52 + auVar59._8_4_ >> auVar163;
    piVar1[3] = auVar94._12_4_ + iVar52 + auVar59._12_4_ >> auVar163;
    piVar1 = (int *)((long)out[num_cols * 0xf] + lVar43);
    *piVar1 = auVar137._0_4_ + iVar52 + auVar106._0_4_ >> auVar163;
    piVar1[1] = auVar137._4_4_ + iVar52 + auVar106._4_4_ >> auVar163;
    piVar1[2] = auVar137._8_4_ + iVar52 + auVar106._8_4_ >> auVar163;
    piVar1[3] = auVar137._12_4_ + iVar52 + auVar106._12_4_ >> auVar163;
  }
  return;
}

Assistant:

static void fadst16x16_sse4_1(__m128i *in, __m128i *out, int bit,
                              const int num_cols) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospim2 = _mm_set1_epi32(-cospi[2]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospim10 = _mm_set1_epi32(-cospi[10]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospim18 = _mm_set1_epi32(-cospi[18]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospim26 = _mm_set1_epi32(-cospi[26]);
  const __m128i cospi34 = _mm_set1_epi32(cospi[34]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospim34 = _mm_set1_epi32(-cospi[34]);
  const __m128i cospi42 = _mm_set1_epi32(cospi[42]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospim42 = _mm_set1_epi32(-cospi[42]);
  const __m128i cospi50 = _mm_set1_epi32(cospi[50]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospi58 = _mm_set1_epi32(cospi[58]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();

  __m128i u[16], v[16], x, y;
  int col;

  for (col = 0; col < num_cols; ++col) {
    // stage 0
    // stage 1
    u[0] = in[0 * num_cols + col];
    u[1] = _mm_sub_epi32(zero, in[15 * num_cols + col]);
    u[2] = _mm_sub_epi32(zero, in[7 * num_cols + col]);
    u[3] = in[8 * num_cols + col];
    u[4] = _mm_sub_epi32(zero, in[3 * num_cols + col]);
    u[5] = in[12 * num_cols + col];
    u[6] = in[4 * num_cols + col];
    u[7] = _mm_sub_epi32(zero, in[11 * num_cols + col]);
    u[8] = _mm_sub_epi32(zero, in[1 * num_cols + col]);
    u[9] = in[14 * num_cols + col];
    u[10] = in[6 * num_cols + col];
    u[11] = _mm_sub_epi32(zero, in[9 * num_cols + col]);
    u[12] = in[2 * num_cols + col];
    u[13] = _mm_sub_epi32(zero, in[13 * num_cols + col]);
    u[14] = _mm_sub_epi32(zero, in[5 * num_cols + col]);
    u[15] = in[10 * num_cols + col];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];

    x = _mm_mullo_epi32(u[2], cospi32);
    y = _mm_mullo_epi32(u[3], cospi32);
    v[2] = _mm_add_epi32(x, y);
    v[2] = _mm_add_epi32(v[2], rnding);
    v[2] = _mm_srai_epi32(v[2], bit);

    v[3] = _mm_sub_epi32(x, y);
    v[3] = _mm_add_epi32(v[3], rnding);
    v[3] = _mm_srai_epi32(v[3], bit);

    v[4] = u[4];
    v[5] = u[5];

    x = _mm_mullo_epi32(u[6], cospi32);
    y = _mm_mullo_epi32(u[7], cospi32);
    v[6] = _mm_add_epi32(x, y);
    v[6] = _mm_add_epi32(v[6], rnding);
    v[6] = _mm_srai_epi32(v[6], bit);

    v[7] = _mm_sub_epi32(x, y);
    v[7] = _mm_add_epi32(v[7], rnding);
    v[7] = _mm_srai_epi32(v[7], bit);

    v[8] = u[8];
    v[9] = u[9];

    x = _mm_mullo_epi32(u[10], cospi32);
    y = _mm_mullo_epi32(u[11], cospi32);
    v[10] = _mm_add_epi32(x, y);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[11] = _mm_sub_epi32(x, y);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = u[12];
    v[13] = u[13];

    x = _mm_mullo_epi32(u[14], cospi32);
    y = _mm_mullo_epi32(u[15], cospi32);
    v[14] = _mm_add_epi32(x, y);
    v[14] = _mm_add_epi32(v[14], rnding);
    v[14] = _mm_srai_epi32(v[14], bit);

    v[15] = _mm_sub_epi32(x, y);
    v[15] = _mm_add_epi32(v[15], rnding);
    v[15] = _mm_srai_epi32(v[15], bit);

    // stage 3
    u[0] = _mm_add_epi32(v[0], v[2]);
    u[1] = _mm_add_epi32(v[1], v[3]);
    u[2] = _mm_sub_epi32(v[0], v[2]);
    u[3] = _mm_sub_epi32(v[1], v[3]);
    u[4] = _mm_add_epi32(v[4], v[6]);
    u[5] = _mm_add_epi32(v[5], v[7]);
    u[6] = _mm_sub_epi32(v[4], v[6]);
    u[7] = _mm_sub_epi32(v[5], v[7]);
    u[8] = _mm_add_epi32(v[8], v[10]);
    u[9] = _mm_add_epi32(v[9], v[11]);
    u[10] = _mm_sub_epi32(v[8], v[10]);
    u[11] = _mm_sub_epi32(v[9], v[11]);
    u[12] = _mm_add_epi32(v[12], v[14]);
    u[13] = _mm_add_epi32(v[13], v[15]);
    u[14] = _mm_sub_epi32(v[12], v[14]);
    u[15] = _mm_sub_epi32(v[13], v[15]);

    // stage 4
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = half_btf_sse4_1(&cospi16, &u[4], &cospi48, &u[5], &rnding, bit);
    v[5] = half_btf_sse4_1(&cospi48, &u[4], &cospim16, &u[5], &rnding, bit);
    v[6] = half_btf_sse4_1(&cospim48, &u[6], &cospi16, &u[7], &rnding, bit);
    v[7] = half_btf_sse4_1(&cospi16, &u[6], &cospi48, &u[7], &rnding, bit);
    v[8] = u[8];
    v[9] = u[9];
    v[10] = u[10];
    v[11] = u[11];
    v[12] = half_btf_sse4_1(&cospi16, &u[12], &cospi48, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi48, &u[12], &cospim16, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospim48, &u[14], &cospi16, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi16, &u[14], &cospi48, &u[15], &rnding, bit);

    // stage 5
    u[0] = _mm_add_epi32(v[0], v[4]);
    u[1] = _mm_add_epi32(v[1], v[5]);
    u[2] = _mm_add_epi32(v[2], v[6]);
    u[3] = _mm_add_epi32(v[3], v[7]);
    u[4] = _mm_sub_epi32(v[0], v[4]);
    u[5] = _mm_sub_epi32(v[1], v[5]);
    u[6] = _mm_sub_epi32(v[2], v[6]);
    u[7] = _mm_sub_epi32(v[3], v[7]);
    u[8] = _mm_add_epi32(v[8], v[12]);
    u[9] = _mm_add_epi32(v[9], v[13]);
    u[10] = _mm_add_epi32(v[10], v[14]);
    u[11] = _mm_add_epi32(v[11], v[15]);
    u[12] = _mm_sub_epi32(v[8], v[12]);
    u[13] = _mm_sub_epi32(v[9], v[13]);
    u[14] = _mm_sub_epi32(v[10], v[14]);
    u[15] = _mm_sub_epi32(v[11], v[15]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];
    v[8] = half_btf_sse4_1(&cospi8, &u[8], &cospi56, &u[9], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi56, &u[8], &cospim8, &u[9], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi40, &u[10], &cospi24, &u[11], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi24, &u[10], &cospim40, &u[11], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospim56, &u[12], &cospi8, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi8, &u[12], &cospi56, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospim24, &u[14], &cospi40, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi40, &u[14], &cospi24, &u[15], &rnding, bit);

    // stage 7
    u[0] = _mm_add_epi32(v[0], v[8]);
    u[1] = _mm_add_epi32(v[1], v[9]);
    u[2] = _mm_add_epi32(v[2], v[10]);
    u[3] = _mm_add_epi32(v[3], v[11]);
    u[4] = _mm_add_epi32(v[4], v[12]);
    u[5] = _mm_add_epi32(v[5], v[13]);
    u[6] = _mm_add_epi32(v[6], v[14]);
    u[7] = _mm_add_epi32(v[7], v[15]);
    u[8] = _mm_sub_epi32(v[0], v[8]);
    u[9] = _mm_sub_epi32(v[1], v[9]);
    u[10] = _mm_sub_epi32(v[2], v[10]);
    u[11] = _mm_sub_epi32(v[3], v[11]);
    u[12] = _mm_sub_epi32(v[4], v[12]);
    u[13] = _mm_sub_epi32(v[5], v[13]);
    u[14] = _mm_sub_epi32(v[6], v[14]);
    u[15] = _mm_sub_epi32(v[7], v[15]);

    // stage 8
    v[0] = half_btf_sse4_1(&cospi2, &u[0], &cospi62, &u[1], &rnding, bit);
    v[1] = half_btf_sse4_1(&cospi62, &u[0], &cospim2, &u[1], &rnding, bit);
    v[2] = half_btf_sse4_1(&cospi10, &u[2], &cospi54, &u[3], &rnding, bit);
    v[3] = half_btf_sse4_1(&cospi54, &u[2], &cospim10, &u[3], &rnding, bit);
    v[4] = half_btf_sse4_1(&cospi18, &u[4], &cospi46, &u[5], &rnding, bit);
    v[5] = half_btf_sse4_1(&cospi46, &u[4], &cospim18, &u[5], &rnding, bit);
    v[6] = half_btf_sse4_1(&cospi26, &u[6], &cospi38, &u[7], &rnding, bit);
    v[7] = half_btf_sse4_1(&cospi38, &u[6], &cospim26, &u[7], &rnding, bit);
    v[8] = half_btf_sse4_1(&cospi34, &u[8], &cospi30, &u[9], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi30, &u[8], &cospim34, &u[9], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi42, &u[10], &cospi22, &u[11], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi22, &u[10], &cospim42, &u[11], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospi50, &u[12], &cospi14, &u[13], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi14, &u[12], &cospim50, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi58, &u[14], &cospi6, &u[15], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi6, &u[14], &cospim58, &u[15], &rnding, bit);

    // stage 9
    out[0 * num_cols + col] = v[1];
    out[1 * num_cols + col] = v[14];
    out[2 * num_cols + col] = v[3];
    out[3 * num_cols + col] = v[12];
    out[4 * num_cols + col] = v[5];
    out[5 * num_cols + col] = v[10];
    out[6 * num_cols + col] = v[7];
    out[7 * num_cols + col] = v[8];
    out[8 * num_cols + col] = v[9];
    out[9 * num_cols + col] = v[6];
    out[10 * num_cols + col] = v[11];
    out[11 * num_cols + col] = v[4];
    out[12 * num_cols + col] = v[13];
    out[13 * num_cols + col] = v[2];
    out[14 * num_cols + col] = v[15];
    out[15 * num_cols + col] = v[0];
  }
}